

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void pumpChildStdio(int childStdinFd,int childStdoutFd,int childStderrFd)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  fd_set local_b0;
  
  iVar5 = childStderrFd;
  if (childStderrFd < childStdoutFd) {
    iVar5 = childStdoutFd;
  }
  if (iVar5 < 1) {
    iVar5 = 0;
  }
  iVar2 = childStdoutFd + 0x3f;
  if (-1 < childStdoutFd) {
    iVar2 = childStdoutFd;
  }
  uVar6 = 1L << ((byte)childStdoutFd & 0x3f);
  iVar3 = childStderrFd + 0x3f;
  if (-1 < childStderrFd) {
    iVar3 = childStderrFd;
  }
  uVar7 = 1L << ((byte)(childStderrFd % 0x40) & 0x3f);
  do {
    do {
      local_b0.fds_bits[0xd] = 0;
      local_b0.fds_bits[0xe] = 0;
      local_b0.fds_bits[0xb] = 0;
      local_b0.fds_bits[0xc] = 0;
      local_b0.fds_bits[9] = 0;
      local_b0.fds_bits[10] = 0;
      local_b0.fds_bits[7] = 0;
      local_b0.fds_bits[8] = 0;
      local_b0.fds_bits[5] = 0;
      local_b0.fds_bits[6] = 0;
      local_b0.fds_bits[3] = 0;
      local_b0.fds_bits[4] = 0;
      local_b0.fds_bits[1] = 0;
      local_b0.fds_bits[2] = 0;
      local_b0.fds_bits[0xf] = 0;
      local_b0.fds_bits[0] = 1;
      local_b0.fds_bits[iVar2 >> 6] = local_b0.fds_bits[iVar2 >> 6] | uVar6;
      if (childStderrFd != -1) {
        local_b0.fds_bits[iVar3 >> 6] = local_b0.fds_bits[iVar3 >> 6] | uVar7;
      }
      iVar4 = select(iVar5 + 1,&local_b0,(fd_set *)0x0,(fd_set *)0x0,(timeval *)0x0);
      if (iVar4 == -1) goto LAB_00114683;
      if ((local_b0.fds_bits[0] & 1U) != 0) {
        bVar1 = pump("STDIN",0,childStdinFd);
        if (!bVar1) goto LAB_00114683;
      }
      if ((local_b0.fds_bits[iVar2 >> 6] & uVar6) != 0) {
        bVar1 = pump("STDOUT",childStdoutFd,1);
        if (!bVar1) goto LAB_00114683;
      }
    } while ((local_b0.fds_bits[iVar3 >> 6] & uVar7) == 0);
    bVar1 = pump("STDERR",childStderrFd,2);
  } while (bVar1);
LAB_00114683:
  puts("PROCESS FINISHED!");
  return;
}

Assistant:

void
pumpChildStdio(
	int childStdinFd,
	int childStdoutFd,
	int childStderrFd
) {
	int result;
	int tmp = AXL_MAX(childStdoutFd, childStderrFd);
	int selectFd = AXL_MAX(tmp, STDIN_FILENO) + 1;

	for (;;) {
		fd_set readSet = { 0 };

		FD_SET(STDIN_FILENO, &readSet);
		FD_SET(childStdoutFd, &readSet);

		if (childStderrFd != -1)
			FD_SET(childStderrFd, &readSet);

		result = ::select(selectFd, &readSet, NULL, NULL, NULL);
		if (result == -1)
			break;

		if (FD_ISSET(STDIN_FILENO, &readSet))
			if (!pump("STDIN", STDIN_FILENO, childStdinFd))
				break;

		if (FD_ISSET(childStdoutFd, &readSet))
			if (!pump("STDOUT", childStdoutFd, STDOUT_FILENO))
				break;

		if (FD_ISSET(childStderrFd, &readSet))
			if (!pump("STDERR", childStderrFd, STDERR_FILENO))
				break;
	}

	printf("PROCESS FINISHED!\n");
}